

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O3

string * parse_host<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                   (string *__return_storage_ptr__,
                   request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                   *request)

{
  long lVar1;
  string_view sVar2;
  long *local_38 [2];
  long local_28 [2];
  
  sVar2 = boost::beast::http::basic_fields<std::allocator<char>_>::at
                    ((basic_fields<std::allocator<char>_> *)request,host);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar2.ptr_,sVar2.ptr_ + sVar2.len_);
  lVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x15abe3,0);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parse_host(const http::request<Body, http::basic_fields<Allocator>>& request) {
    std::string host = request.at(http::field::host).to_string();
    size_t pos = host.find(":");
    if (pos != std::string::npos) {
        host = host.substr(0, pos);
    }

    return host;
}